

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

UBool __thiscall icu_63::UVector32::containsAll(UVector32 *this,UVector32 *other)

{
  uint uVar1;
  int32_t *piVar2;
  ulong uVar3;
  int32_t iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = other->count;
  piVar2 = other->elements;
  uVar6 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  do {
    uVar5 = uVar3;
    if (uVar6 == uVar5) break;
    iVar4 = indexOf(this,piVar2[uVar5],0);
    uVar3 = uVar5 + 1;
  } while (-1 < iVar4);
  return (long)(int)uVar1 <= (long)uVar5;
}

Assistant:

UBool UVector32::containsAll(const UVector32& other) const {
    for (int32_t i=0; i<other.size(); ++i) {
        if (indexOf(other.elements[i]) < 0) {
            return FALSE;
        }
    }
    return TRUE;
}